

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

void __thiscall chrono::ChStreamOutAscii::Format(ChStreamOutAscii *this,char *formatString,...)

{
  char *pcVar1;
  char in_AL;
  double *pdVar2;
  undefined8 *puVar3;
  uint *puVar4;
  int *piVar5;
  ChException *this_00;
  undefined8 in_RCX;
  ulong uVar6;
  undefined8 in_RDX;
  char cVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argList;
  string local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (formatString == (char *)0x0) {
    this_00 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_f8,"Bad format string",(allocator *)argList);
    ChException::ChException(this_00,&local_f8);
    __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
  }
  argList[0].reg_save_area = local_d8;
  argList[0].overflow_arg_area = &stack0x00000008;
  argList[0].gp_offset = 0x10;
  argList[0].fp_offset = 0x30;
  do {
    cVar7 = *formatString;
    if (cVar7 == '%') {
      cVar7 = formatString[1];
      pcVar1 = formatString + 1;
      if (cVar7 == 'd') {
        uVar6 = argList[0]._0_8_ & 0xffffffff;
        if (uVar6 < 0x29) {
          argList[0].gp_offset = argList[0].gp_offset + 8;
          piVar5 = (int *)(uVar6 + (long)argList[0].reg_save_area);
        }
        else {
          piVar5 = (int *)argList[0].overflow_arg_area;
          argList[0].overflow_arg_area = (void *)((long)argList[0].overflow_arg_area + 8);
        }
        operator<<(this,*piVar5);
        formatString = pcVar1;
      }
      else if (cVar7 == 'f') {
        uVar6 = (ulong)argList[0].fp_offset;
        if (uVar6 < 0xa1) {
          argList[0].fp_offset = argList[0].fp_offset + 0x10;
          pdVar2 = (double *)(uVar6 + (long)argList[0].reg_save_area);
        }
        else {
          pdVar2 = (double *)argList[0].overflow_arg_area;
          argList[0].overflow_arg_area = (void *)((long)argList[0].overflow_arg_area + 8);
        }
        operator<<(this,*pdVar2);
        formatString = pcVar1;
      }
      else if (cVar7 == 'u') {
        uVar6 = argList[0]._0_8_ & 0xffffffff;
        if (uVar6 < 0x29) {
          argList[0].gp_offset = argList[0].gp_offset + 8;
          puVar4 = (uint *)(uVar6 + (long)argList[0].reg_save_area);
        }
        else {
          puVar4 = (uint *)argList[0].overflow_arg_area;
          argList[0].overflow_arg_area = (void *)((long)argList[0].overflow_arg_area + 8);
        }
        operator<<(this,*puVar4);
        formatString = pcVar1;
      }
      else {
        if (cVar7 != 's') {
          cVar7 = '%';
          goto LAB_00a36d34;
        }
        uVar6 = argList[0]._0_8_ & 0xffffffff;
        if (uVar6 < 0x29) {
          argList[0].gp_offset = argList[0].gp_offset + 8;
          puVar3 = (undefined8 *)(uVar6 + (long)argList[0].reg_save_area);
        }
        else {
          puVar3 = (undefined8 *)argList[0].overflow_arg_area;
          argList[0].overflow_arg_area = (void *)((long)argList[0].overflow_arg_area + 8);
        }
        if ((char *)*puVar3 != (char *)0x0) {
          operator<<(this,(char *)*puVar3);
          formatString = pcVar1;
        }
      }
    }
    else {
      if (cVar7 == '\0') {
        return;
      }
LAB_00a36d34:
      operator<<(this,cVar7);
    }
    formatString = formatString + 1;
  } while( true );
}

Assistant:

void ChStreamOutAscii::Format(char* formatString, ...) {
    if (formatString == NULL) {
        throw(ChException("Bad format string"));
    }

    va_list argList;

    // Set va_list to the beginning of optional arguments

    va_start(argList, formatString);
    char* ptr = formatString;

    while (*ptr != '\0') {
        char* str = NULL;
        int nInteger = 0;
        unsigned int unInt = 0;
        double dDoub = 0;

        if (*ptr == '%') {
            switch (*(ptr + 1)) {
                case 's':
                    str = va_arg(argList, char*);

                    if (NULL == str)
                        break;
                    *this << str;
                    ptr++;
                    break;

                case 'd':
                    nInteger = va_arg(argList, int);
                    *this << nInteger;
                    ptr++;
                    break;

                case 'u':
                    unInt = va_arg(argList, unsigned int);
                    *this << unInt;
                    ptr++;
                    break;

                case 'f':
                    dDoub = va_arg(argList, double);
                    *this << dDoub;
                    ptr++;
                    break;
                default:
                    *this << *ptr;
            }
        } else {
            *this << *ptr;
        }

        ptr++;
    }
}